

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O1

ostream * plot::detail::operator<<(ostream *stream,value_type *line)

{
  Margin<plot::Frame<plot::BrailleCanvas_*>_> *pMVar1;
  ostream oVar2;
  ostream oVar3;
  int iVar4;
  ostream *poVar5;
  
  poVar5 = stream + *(long *)(*(long *)stream + -0x18);
  if (stream[*(long *)(*(long *)stream + -0x18) + 0xe1] == (ostream)0x0) {
    oVar2 = (ostream)std::ios::widen((char)poVar5);
    poVar5[0xe0] = oVar2;
    poVar5[0xe1] = (ostream)0x1;
  }
  oVar2 = poVar5[0xe0];
  poVar5 = stream + *(long *)(*(long *)stream + -0x18);
  if (stream[*(long *)(*(long *)stream + -0x18) + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar5);
    poVar5[0xe0] = oVar3;
    poVar5[0xe1] = (ostream)0x1;
  }
  poVar5[0xe0] = (ostream)0x20;
  if ((line->overflow_ == 0) &&
     (((line->line_).line_.line_.line_.it_._M_current !=
       (line->end_).line_.line_.line_.it_._M_current ||
      ((line->line_).line_.overflow_ != (line->end_).line_.overflow_)))) {
    *(long *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10) = (long)(int)line->margin_->left_;
    std::__ostream_insert<char,std::char_traits<char>>(stream,"",0);
    poVar5 = operator<<(stream,&(line->line_).line_);
    iVar4 = (int)line->margin_->right_;
  }
  else {
    pMVar1 = line->margin_;
    iVar4 = (int)pMVar1->right_ + (int)((pMVar1->block_).block_)->cols_ + (int)pMVar1->left_ + 2;
    poVar5 = stream;
  }
  *(long *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = (long)iVar4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"",0);
  poVar5 = stream + *(long *)(*(long *)stream + -0x18);
  if (stream[*(long *)(*(long *)stream + -0x18) + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar5);
    poVar5[0xe0] = oVar3;
    poVar5[0xe1] = (ostream)0x1;
  }
  poVar5[0xe0] = oVar2;
  return stream;
}

Assistant:

inline std::ostream& operator<<(std::ostream& stream, margin_line<Block> const& line) {
        auto fill = stream.fill();
        stream << std::setfill(' ');
        if (!line.overflow_ && line.line_ != line.end_) {
            stream << std::setw(line.margin_->left_)
                   << u8""
                   << *line.line_
                   << std::setw(line.margin_->right_)
                   << u8"";
        } else {
            stream << std::setw(line.margin_->size().x)
                   << u8"";
        }

        return stream << std::setfill(fill);
    }